

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O3

bool __thiscall
AutoArgParse::FlagStore::tryParseFlag
          (FlagStore *this,ArgIter *first,ArgIter *last,Policy *foundFlagPolicy)

{
  pointer pcVar1;
  iterator iVar2;
  RepeatedFlagException *this_00;
  string local_48;
  
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->flags)._M_h,first->_M_current);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    if (*(char *)(*(long *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
                                  ._M_cur + 0x28) + 8) == '\x01') {
      this_00 = (RepeatedFlagException *)__cxa_allocate_exception(0x50);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      pcVar1 = (first->_M_current->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar1,pcVar1 + first->_M_current->_M_string_length);
      RepeatedFlagException::RepeatedFlagException(this_00,&local_48);
      __cxa_throw(this_00,&RepeatedFlagException::typeinfo,
                  RepeatedFlagException::~RepeatedFlagException);
    }
    first->_M_current = first->_M_current + 1;
    (**(code **)(**(long **)((long)iVar2.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
                                   ._M_cur + 0x28) + 0x10))
              (*(long **)((long)iVar2.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
                                ._M_cur + 0x28),first,last);
    *foundFlagPolicy =
         *(Policy *)
          (*(long *)((long)iVar2.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
                           ._M_cur + 0x28) + 0xc);
  }
  return iVar2.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

AUTOARGPARSE_INLINE bool FlagStore::tryParseFlag(ArgIter& first, ArgIter& last,
                                                 Policy& foundFlagPolicy) {
    auto flagIter = flags.find(*first);
    if (flagIter != end(flags)) {
        if (flagIter->second->parsed()) {
            throw RepeatedFlagException(*first);
        }
        ++first;
        flagIter->second->parse(first, last);
        foundFlagPolicy = flagIter->second->policy;
        return true;
    } else {
        return false;
    }
}